

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O1

BasicValue * __thiscall
cmm::CMMInterpreter::evaluateFunctionCallExpr
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,VariableEnv *Env,
          FunctionCallAST *FuncCall)

{
  string *__k;
  const_iterator cVar1;
  iterator iVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  size_type *psVar4;
  CMMInterpreter *this_00;
  VariableEnv *Env_00;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> Args;
  string local_70;
  BlockAST *local_50;
  
  __k = &FuncCall->Callee;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>_>
          ::find(&this->UserFunctionMap->_M_t,__k);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->UserFunctionMap->_M_t)._M_impl.super__Rb_tree_header) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>_>_>
            ::find(&(this->NativeFunctionMap)._M_t,__k);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->NativeFunctionMap)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (CMMInterpreter *)&stack0xffffffffffffffb0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     "function `",__k);
      plVar3 = (long *)std::__cxx11::string::append((char *)this_00);
      local_70._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar4) {
        local_70.field_2._M_allocated_capacity = *psVar4;
        local_70.field_2._8_8_ = plVar3[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar4;
      }
      local_70._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      RuntimeError(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_50 != (BlockAST *)&stack0xffffffffffffffc0) {
        operator_delete(local_50);
      }
      _Unwind_Resume(extraout_RAX);
    }
    evaluateArgumentList
              ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)&local_70,this,Env,
               &FuncCall->Arguments);
    (**(code **)(iVar2._M_node + 2))(__return_storage_ptr__,&local_70);
  }
  else {
    evaluateArgumentList
              ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)&local_70,this,Env,
               &FuncCall->Arguments);
    Env_00 = (VariableEnv *)0x0;
    if ((FuncCall->field_0x48 & 1) != 0) {
      Env_00 = Env;
    }
    callUserFunction(__return_storage_ptr__,this,(FunctionDefinitionAST *)(cVar1._M_node + 2),
                     (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)&local_70,Env_00);
  }
  std::__cxx11::_List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::_M_clear
            ((_List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

cvm::BasicValue
CMMInterpreter::evaluateFunctionCallExpr(VariableEnv *Env,
                                         const FunctionCallAST *FuncCall) {
  auto UserFuncIt = UserFunctionMap.find(FuncCall->getCallee());
  if (UserFuncIt != UserFunctionMap.end()) {
    auto Args(evaluateArgumentList(Env, FuncCall->getArguments()));
    return callUserFunction(UserFuncIt->second, Args,
                            FuncCall->isDynamicBound() ? Env : nullptr);
  }

  auto NativeFuncIt = NativeFunctionMap.find(FuncCall->getCallee());
  if (NativeFuncIt != NativeFunctionMap.end()) {
    auto Args(evaluateArgumentList(Env, FuncCall->getArguments()));
    return callNativeFunction(NativeFuncIt->second, Args);
  }

  RuntimeError("function `" + FuncCall->getCallee() + "' is undefined");
  return evaluateFunctionCallExpr(nullptr, nullptr); // Make the compiler happy.
}